

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct
          (CopyPropagateArrays *this,Instruction *conststruct_inst)

{
  pointer pAVar1;
  undefined8 uVar2;
  bool bVar3;
  uint32_t uVar4;
  Instruction *in_RDX;
  pointer *__ptr;
  uint uVar5;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  member_object;
  AccessChainEntry last_access;
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  
  if (in_RDX->opcode_ != OpCompositeConstruct) {
    __assert_fail("conststruct_inst->opcode() == spv::Op::OpCompositeConstruct && \"Expecting an OpCompositeConstruct instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x15d,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(Instruction *)"
                 );
  }
  uVar4 = (in_RDX->has_result_id_ & 1) + 1;
  if (in_RDX->has_type_id_ == false) {
    uVar4 = (uint)in_RDX->has_result_id_;
  }
  Instruction::GetSingleWordOperand(in_RDX,uVar4);
  GetSourceObjectIfAny((CopyPropagateArrays *)local_48,(uint32_t)conststruct_inst);
  if ((local_48 != (undefined1  [8])0x0) &&
     ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
         *)((long)local_48 + 8))->
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
         *)((long)local_48 + 8))->
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    local_40._8_8_ =
         (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            *)((long)local_48 + 8))->
         super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1];
    bVar3 = IsAccessChainIndexValidAndEqualTo
                      ((CopyPropagateArrays *)conststruct_inst,(AccessChainEntry *)(local_40 + 8),0)
    ;
    if (bVar3) {
      pAVar1 = (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                  *)((long)local_48 + 8))->
               super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             *)((long)local_48 + 8))->
          super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
          )._M_impl.super__Vector_impl_data._M_start == pAVar1) {
        __assert_fail("IsMember()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.h"
                      ,0x5f,
                      "void spvtools::opt::CopyPropagateArrays::MemoryObject::PopIndirection()");
      }
      (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
         *)((long)local_48 + 8))->
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      )._M_impl.super__Vector_impl_data._M_finish = pAVar1 + -1;
      uVar4 = MemoryObject::GetNumberOfMembers((MemoryObject *)local_48);
      uVar5 = (in_RDX->has_result_id_ & 1) + 1;
      if (in_RDX->has_type_id_ == false) {
        uVar5 = (uint)in_RDX->has_result_id_;
      }
      if (uVar4 == (int)((ulong)((long)(in_RDX->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(in_RDX->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                   - uVar5) {
        uVar5 = (in_RDX->has_result_id_ & 1) + 1;
        if (in_RDX->has_type_id_ == false) {
          uVar5 = (uint)in_RDX->has_result_id_;
        }
        if (1 < (int)((ulong)((long)(in_RDX->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_RDX->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar5) {
          uVar4 = 1;
          do {
            Instruction::GetSingleWordOperand(in_RDX,uVar5 + uVar4);
            GetSourceObjectIfAny((CopyPropagateArrays *)local_40,(uint32_t)conststruct_inst);
            uVar2 = local_40._0_8_;
            if (((MemoryObject *)local_40._0_8_ == (MemoryObject *)0x0) ||
               ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   *)(local_40._0_8_ + 8))->
                super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                )._M_impl.super__Vector_impl_data._M_start == *(pointer *)(local_40._0_8_ + 0x10)))
            {
LAB_0058f8b6:
              (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
              if ((MemoryObject *)local_40._0_8_ != (MemoryObject *)0x0) {
                std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                          ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)
                           local_40,(MemoryObject *)local_40._0_8_);
              }
              goto LAB_0058f893;
            }
            bVar3 = MemoryObject::Contains((MemoryObject *)local_48,(MemoryObject *)local_40._0_8_);
            if (!bVar3) goto LAB_0058f8b6;
            local_40._8_8_ = (*(pointer *)(uVar2 + 0x10))[-1];
            bVar3 = IsAccessChainIndexValidAndEqualTo
                              ((CopyPropagateArrays *)conststruct_inst,
                               (AccessChainEntry *)(local_40 + 8),uVar4);
            if (!bVar3) goto LAB_0058f8b6;
            if ((MemoryObject *)local_40._0_8_ != (MemoryObject *)0x0) {
              std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                        ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)
                         local_40,(MemoryObject *)local_40._0_8_);
            }
            uVar4 = uVar4 + 1;
            uVar5 = (in_RDX->has_result_id_ & 1) + 1;
            if (in_RDX->has_type_id_ == false) {
              uVar5 = (uint)in_RDX->has_result_id_;
            }
          } while (uVar4 < (int)((ulong)((long)(in_RDX->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(in_RDX->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555 - uVar5);
        }
        (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)local_48;
        local_48 = (undefined1  [8])0x0;
        goto LAB_0058f893;
      }
    }
  }
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
LAB_0058f893:
  if (local_48 != (undefined1  [8])0x0) {
    std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
              ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)local_48,
               (MemoryObject *)local_48);
  }
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(
    Instruction* conststruct_inst) {
  assert(conststruct_inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Expecting an OpCompositeConstruct instruction.");

  // If every operand in the instruction are part of the same memory object, and
  // are being combined in the same order, then the result is the same as the
  // parent.

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, 0)) {
    return nullptr;
  }

  memory_object->PopIndirection();
  if (memory_object->GetNumberOfMembers() !=
      conststruct_inst->NumInOperands()) {
    return nullptr;
  }

  for (uint32_t i = 1; i < conststruct_inst->NumInOperands(); ++i) {
    std::unique_ptr<MemoryObject> member_object =
        GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(i));

    if (!member_object) {
      return nullptr;
    }

    if (!member_object->IsMember()) {
      return nullptr;
    }

    if (!memory_object->Contains(member_object.get())) {
      return nullptr;
    }

    last_access = member_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(last_access, i)) {
      return nullptr;
    }
  }
  return memory_object;
}